

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

int test_ints(void)

{
  uint3 uVar1;
  uint7 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  char *d3;
  char *d4;
  byte *local_40;
  char *local_38;
  
  _plan(0xa2,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_ints");
  buf[1] = -1;
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x01",9,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\0'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_check_int(-0x01) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    break;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    break;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    break;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      iVar8 = 1;
      goto LAB_001157cc;
    }
    test_ints();
    goto LAB_0011898b;
  }
  iVar8 = 0;
LAB_001157cc:
  _ok((uint)(uVar6 == 0xffffffffffffffff),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x01)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_decode(mp_encode(-0x01)) == -0x01");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_00115826;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_00115826;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_00115826:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 1));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_check(-0x01)");
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_encode_int(-0x01)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_decode_int(-0x01))");
  _ok((uint)(local_40 == (byte *)(buf + 2)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_next_int(-0x01))");
  _ok((uint)(local_38 == buf + 2),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_check_int(-0x01))");
  _ok(1,"mp_sizeof_int(-0x01) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_sizeof_int(-0x01)");
  _ok((uint)(buf[1] == -1),"memcmp(data, (\"\\xff\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_encode(-0x01) == \"\\xff\"");
  buf[1] = -0x1e;
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x1e",9,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\0'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_check_int(-0x1e) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    break;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    break;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    break;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      iVar8 = 1;
      goto LAB_00115aa8;
    }
LAB_0011898b:
    test_ints();
    goto LAB_00118990;
  }
  iVar8 = 0;
LAB_00115aa8:
  _ok((uint)(uVar6 == 0xffffffffffffffe2),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x1e)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_decode(mp_encode(-0x1e)) == -0x1e");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_00115b02;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_00115b02;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_00115b02:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 1));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_check(-0x1e)");
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_encode_int(-0x1e)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_decode_int(-0x1e))");
  _ok((uint)(local_40 == (byte *)(buf + 2)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_next_int(-0x1e))");
  _ok((uint)(local_38 == buf + 2),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_check_int(-0x1e))");
  _ok(1,"mp_sizeof_int(-0x1e) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_sizeof_int(-0x1e)");
  _ok((uint)(buf[1] == -0x1e),"memcmp(data, (\"\\xe2\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_encode(-0x1e) == \"\\xe2\"");
  buf[1] = -0x1f;
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x1f",9,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\0'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_check_int(-0x1f) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    break;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    break;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    break;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      iVar8 = 1;
      goto LAB_00115d7d;
    }
LAB_00118990:
    test_ints();
    goto LAB_00118995;
  }
  iVar8 = 0;
LAB_00115d7d:
  _ok((uint)(uVar6 == 0xffffffffffffffe1),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x1f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_decode(mp_encode(-0x1f)) == -0x1f");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_00115dd7;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_00115dd7;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_00115dd7:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 1));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_check(-0x1f)");
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_encode_int(-0x1f)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_decode_int(-0x1f))");
  _ok((uint)(local_40 == (byte *)(buf + 2)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_next_int(-0x1f))");
  _ok((uint)(local_38 == buf + 2),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_check_int(-0x1f))");
  _ok(1,"mp_sizeof_int(-0x1f) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_sizeof_int(-0x1f)");
  _ok((uint)(buf[1] == -0x1f),"memcmp(data, (\"\\xe1\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_encode(-0x1f) == \"\\xe1\"");
  buf[1] = -0x20;
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x20",9,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\0'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_check_int(-0x20) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    break;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    break;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    break;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      iVar8 = 1;
      goto LAB_00116052;
    }
LAB_00118995:
    test_ints();
    goto LAB_0011899a;
  }
  iVar8 = 0;
LAB_00116052:
  _ok((uint)(uVar6 == 0xffffffffffffffe0),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x20)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_decode(mp_encode(-0x20)) == -0x20");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_001160ac;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_001160ac;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_001160ac:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 1));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_check(-0x20)");
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_encode_int(-0x20)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_decode_int(-0x20))");
  _ok((uint)(local_40 == (byte *)(buf + 2)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_next_int(-0x20))");
  _ok((uint)(local_38 == buf + 2),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_check_int(-0x20))");
  _ok(1,"mp_sizeof_int(-0x20) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_sizeof_int(-0x20)");
  _ok((uint)(buf[1] == -0x20),"memcmp(data, (\"\\xe0\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_encode(-0x20) == \"\\xe0\"");
  buf[1] = -0x30;
  buf[2] = -0x21;
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x21",9,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\x01'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_check_int(-0x21) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    iVar8 = 1;
    goto LAB_00116338;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    break;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    break;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      break;
    }
LAB_0011899a:
    test_ints();
    goto LAB_0011899f;
  }
  iVar8 = 0;
LAB_00116338:
  _ok((uint)(uVar6 == 0xffffffffffffffdf),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x21)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_decode(mp_encode(-0x21)) == -0x21");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_00116392;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_00116392;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_00116392:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 2));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_check(-0x21)");
  _ok(1,"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_encode_int(-0x21)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_decode_int(-0x21))");
  _ok((uint)(local_40 == (byte *)(buf + 3)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_next_int(-0x21))");
  _ok((uint)(local_38 == buf + 3),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_check_int(-0x21))");
  _ok(1,"mp_sizeof_int(-0x21) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_sizeof_int(-0x21)");
  _ok((uint)(CONCAT11(buf[2],buf[1]) == -0x2030),"memcmp(data, (\"\\xd0\\xdf\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_encode(-0x21) == \"\\xd0\\xdf\"");
  buf[1] = -0x30;
  buf[2] = -0x7f;
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x7f",9,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\x01'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_check_int(-0x7f) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    iVar8 = 1;
    goto LAB_00116612;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    break;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    break;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      break;
    }
LAB_0011899f:
    test_ints();
    goto LAB_001189a4;
  }
  iVar8 = 0;
LAB_00116612:
  _ok((uint)(uVar6 == 0xffffffffffffff81),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_decode(mp_encode(-0x7f)) == -0x7f");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_0011666c;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_0011666c;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_0011666c:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 2));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_check(-0x7f)");
  _ok(1,"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_encode_int(-0x7f)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_decode_int(-0x7f))");
  _ok((uint)(local_40 == (byte *)(buf + 3)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_next_int(-0x7f))");
  _ok((uint)(local_38 == buf + 3),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_check_int(-0x7f))");
  _ok(1,"mp_sizeof_int(-0x7f) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_sizeof_int(-0x7f)");
  _ok((uint)(CONCAT11(buf[2],buf[1]) == -0x7e30),"memcmp(data, (\"\\xd0\\x81\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_encode(-0x7f) == \"\\xd0\\x81\"");
  buf[1] = -0x30;
  buf[2] = -0x80;
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x80",9,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\x01'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_check_int(-0x80) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    iVar8 = 1;
    goto LAB_001168e5;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    break;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    break;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      break;
    }
LAB_001189a4:
    test_ints();
    goto LAB_001189a9;
  }
  iVar8 = 0;
LAB_001168e5:
  _ok((uint)(uVar6 == 0xffffffffffffff80),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_decode(mp_encode(-0x80)) == -0x80");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_0011693f;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_0011693f;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_0011693f:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 2));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_check(-0x80)");
  _ok(1,"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_encode_int(-0x80)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_decode_int(-0x80))");
  _ok((uint)(local_40 == (byte *)(buf + 3)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_next_int(-0x80))");
  _ok((uint)(local_38 == buf + 3),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_check_int(-0x80))");
  _ok(1,"mp_sizeof_int(-0x80) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_sizeof_int(-0x80)");
  _ok((uint)(CONCAT11(buf[2],buf[1]) == -0x7f30),"memcmp(data, (\"\\xd0\\x80\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_encode(-0x80) == \"\\xd0\\x80\"");
  buf[1] = -0x2f;
  buf[2] = -1;
  buf[3] = '\x7f';
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x81",9,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\x02'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_check_int(-0x81) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    break;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    iVar8 = 1;
    goto LAB_00116bbf;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    break;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      break;
    }
LAB_001189a9:
    test_ints();
    goto LAB_001189ae;
  }
  iVar8 = 0;
LAB_00116bbf:
  _ok((uint)(uVar6 == 0xffffffffffffff7f),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x81)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_decode(mp_encode(-0x81)) == -0x81");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_00116c1b;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_00116c1b;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_00116c1b:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 3));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_check(-0x81)");
  _ok(1,"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_encode_int(-0x81)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_decode_int(-0x81))");
  _ok((uint)(local_40 == (byte *)(buf + 4)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_next_int(-0x81))");
  _ok((uint)(local_38 == buf + 4),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_check_int(-0x81))");
  _ok(1,"mp_sizeof_int(-0x81) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_sizeof_int(-0x81)");
  _ok((uint)(buf[3] == '\x7f' && CONCAT11(buf[2],buf[1]) == -0x2f),
      "memcmp(data, (\"\\xd1\\xff\\x7f\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_encode(-0x81) == \"\\xd1\\xff\\x7f\"");
  buf[1] = -0x2f;
  buf[2] = -0x80;
  buf[3] = '\x01';
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x7fff",0xb,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\x02'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_check_int(-0x7fff) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    break;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    iVar8 = 1;
    goto LAB_00116eb2;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    break;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      break;
    }
LAB_001189ae:
    test_ints();
    goto LAB_001189b3;
  }
  iVar8 = 0;
LAB_00116eb2:
  _ok((uint)(uVar6 == 0xffffffffffff8001),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7fff)"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e
      ,"mp_decode(mp_encode(-0x7fff)) == -0x7fff");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_00116f0e;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_00116f0e;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_00116f0e:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 3));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_check(-0x7fff)");
  _ok(1,"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_encode_int(-0x7fff)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_decode_int(-0x7fff))");
  _ok((uint)(local_40 == (byte *)(buf + 4)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_next_int(-0x7fff))");
  _ok((uint)(local_38 == buf + 4),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_check_int(-0x7fff))");
  _ok(1,"mp_sizeof_int(-0x7fff) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_sizeof_int(-0x7fff)");
  _ok((uint)(buf[3] == '\x01' && CONCAT11(buf[2],buf[1]) == -0x7f2f),
      "memcmp(data, (\"\\xd1\\x80\\x01\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_encode(-0x7fff) == \"\\xd1\\x80\\x01\"");
  buf[1] = -0x2f;
  buf[2] = -0x80;
  buf[3] = '\0';
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x8000",0xb,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\x02'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_check_int(-0x8000) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    break;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    iVar8 = 1;
    goto LAB_0011719e;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    break;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      break;
    }
LAB_001189b3:
    test_ints();
    goto LAB_001189b8;
  }
  iVar8 = 0;
LAB_0011719e:
  _ok((uint)(uVar6 == 0xffffffffffff8000),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x8000)"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f
      ,"mp_decode(mp_encode(-0x8000)) == -0x8000");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_001171fa;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_001171fa;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_001171fa:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 3));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_check(-0x8000)");
  _ok(1,"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_encode_int(-0x8000)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_decode_int(-0x8000))");
  _ok((uint)(local_40 == (byte *)(buf + 4)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_next_int(-0x8000))");
  _ok((uint)(local_38 == buf + 4),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_check_int(-0x8000))");
  _ok(1,"mp_sizeof_int(-0x8000) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_sizeof_int(-0x8000)");
  _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == -0x7f2f),
      "memcmp(data, (\"\\xd1\\x80\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_encode(-0x8000) == \"\\xd1\\x80\\x00\"");
  buf[1] = -0x2e;
  buf[2] = -1;
  buf[3] = -1;
  buf[4] = '\x7f';
  buf[5] = -1;
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x8001",0xb,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\x04'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_check_int(-0x8001) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    break;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    break;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    iVar8 = 1;
    goto LAB_00117488;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      break;
    }
LAB_001189b8:
    test_ints();
    goto LAB_001189bd;
  }
  iVar8 = 0;
LAB_00117488:
  _ok((uint)(uVar6 == 0xffffffffffff7fff),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x8001)"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111
      ,"mp_decode(mp_encode(-0x8001)) == -0x8001");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_001174e4;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_001174e4;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_001174e4:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 5));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_check(-0x8001)");
  _ok(1,"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_encode_int(-0x8001)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_decode_int(-0x8001))");
  _ok((uint)(local_40 == (byte *)(buf + 6)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_next_int(-0x8001))");
  _ok((uint)(local_38 == buf + 6),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_check_int(-0x8001))");
  _ok(1,"mp_sizeof_int(-0x8001) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_sizeof_int(-0x8001)");
  _ok((uint)((buf._5_4_ & 0xff) == 0xff &&
            CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x7fffffd2),
      "memcmp(data, (\"\\xd2\\xff\\xff\\x7f\\xff\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_encode(-0x8001) == \"\\xd2\\xff\\xff\\x7f\\xff\"");
  buf[1] = -0x2e;
  buf[2] = -0x80;
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\x01';
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x7fffffff",0xf,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\x04'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_check_int(-0x7fffffff) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    break;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    break;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    iVar8 = 1;
    goto LAB_0011777d;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      break;
    }
LAB_001189bd:
    test_ints();
    goto LAB_001189c2;
  }
  iVar8 = 0;
LAB_0011777d:
  _ok((uint)(uVar6 == 0xffffffff80000001),
      "mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7fffffff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_decode(mp_encode(-0x7fffffff)) == -0x7fffffff");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_001177d9;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_001177d9;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_001177d9:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 5));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_check(-0x7fffffff)");
  _ok(1,"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_encode_int(-0x7fffffff)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_decode_int(-0x7fffffff))");
  _ok((uint)(local_40 == (byte *)(buf + 6)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_next_int(-0x7fffffff))");
  _ok((uint)(local_38 == buf + 6),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_check_int(-0x7fffffff))");
  _ok(1,"mp_sizeof_int(-0x7fffffff) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_sizeof_int(-0x7fffffff)");
  _ok((uint)((buf._5_4_ & 0xff) == 1 &&
            CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x80d2),
      "memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x01\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_encode(-0x7fffffff) == \"\\xd2\\x80\\x00\\x00\\x01\"");
  buf[1] = -0x2e;
  buf[2] = -0x80;
  buf[3] = '\0';
  buf[4] = '\0';
  buf._5_4_ = buf._5_4_ & 0xffffff00;
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x80000000LL",0x11,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\x04'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_check_int(-0x80000000LL) == 0");
  switch(buf[1]) {
  case -0x30:
    uVar6 = (ulong)buf[2];
    break;
  case -0x2f:
    uVar6 = (ulong)(short)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    break;
  case -0x2e:
    uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar6 = (ulong)(int)(buf._5_4_ & 0xff | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        (uint)uVar1 << 0x18);
    iVar8 = 1;
    goto LAB_00117a68;
  case -0x2d:
    uVar2 = CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2])));
    uVar6 = (ulong)(byte)buf[9] | ((ulong)uVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)uVar2 & 0xff0000000000) >> 0x18 | ((ulong)uVar2 & 0xff00000000) >> 8 |
            ((ulong)uVar2 & 0xff000000) << 8 | ((ulong)uVar2 & 0xff0000) << 0x18 |
            ((ulong)uVar2 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar2) << 0x38;
    break;
  default:
    if (0xdf < (byte)buf[1]) {
      uVar6 = (ulong)buf[1];
      break;
    }
LAB_001189c2:
    test_ints();
    goto LAB_001189c7;
  }
  iVar8 = 0;
LAB_00117a68:
  _ok((uint)(uVar6 == 0xffffffff80000000),
      "mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80000000LL)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_decode(mp_encode(-0x80000000LL)) == -0x80000000LL");
  lVar10 = 1;
  do {
    lVar7 = (long)""[*local_40];
    if (lVar7 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_00117ac4;
      }
      if (-0x20 < ""[*local_40]) {
        lVar10 = lVar10 - lVar7;
        local_40 = local_40 + 1;
        goto LAB_00117ac4;
      }
      mp_next_slowpath((char **)&local_40,lVar10);
      bVar3 = false;
      lVar7 = lVar10;
    }
    else {
      local_40 = local_40 + 1 + lVar7;
LAB_00117ac4:
      bVar3 = true;
      lVar7 = lVar10;
    }
  } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
  iVar4 = mp_check(&local_38,(char *)(local_40 + 5));
  _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_check(-0x80000000LL)");
  _ok(1,"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_encode_int(-0x80000000LL)");
  _ok(iVar8,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_decode_int(-0x80000000LL))");
  _ok((uint)(local_40 == (byte *)(buf + 6)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_next_int(-0x80000000LL))");
  _ok((uint)(local_38 == buf + 6),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_check_int(-0x80000000LL))");
  _ok(1,"mp_sizeof_int(-0x80000000LL) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_sizeof_int(-0x80000000LL)");
  _ok((uint)((buf._5_4_ & 0xff) == 0 &&
            CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x80d2),
      "memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_encode(-0x80000000LL) == \"\\xd2\\x80\\x00\\x00\\x00\"");
  buf[1] = -0x2d;
  buf[2] = -1;
  buf[3] = -1;
  buf[4] = -1;
  buf[5] = -1;
  buf[6] = '\x7f';
  buf[7] = -1;
  buf[8] = -1;
  buf[9] = -1;
  local_40 = (byte *)(buf + 1);
  local_38 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x80000001LL",0x11,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
  _ok((uint)(""[(byte)buf[1]] == '\b'),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "mp_check_int(-0x80000001LL) == 0");
  if ((byte)buf[1] - 0xd0 < 3) {
    uVar9 = 0;
    iVar8 = 0;
LAB_00117d41:
    _ok(uVar9,"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80000001LL)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x116,"mp_decode(mp_encode(-0x80000001LL)) == -0x80000001LL");
    lVar10 = 1;
    do {
      lVar7 = (long)""[*local_40];
      if (lVar7 < 0) {
        if (*local_40 == 0xd9) {
          local_40 = local_40 + (ulong)local_40[1] + 2;
          goto LAB_00117d90;
        }
        if (-0x20 < ""[*local_40]) {
          lVar10 = lVar10 - lVar7;
          local_40 = local_40 + 1;
          goto LAB_00117d90;
        }
        mp_next_slowpath((char **)&local_40,lVar10);
        bVar3 = false;
        lVar7 = lVar10;
      }
      else {
        local_40 = local_40 + 1 + lVar7;
LAB_00117d90:
        bVar3 = true;
        lVar7 = lVar10;
      }
    } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
    iVar4 = mp_check(&local_38,(char *)(local_40 + 9));
    _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 9)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x116,"mp_check(-0x80000001LL)");
    _ok(1,"(d1 - data) == (9)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x116,"len(mp_encode_int(-0x80000001LL)");
    _ok(iVar8,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x116,"len(mp_decode_int(-0x80000001LL))");
    _ok((uint)(local_40 == (byte *)(buf + 10)),"d1 == d3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x116,"len(mp_next_int(-0x80000001LL))");
    _ok((uint)(local_38 == buf + 10),"d1 == d4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x116,"len(mp_check_int(-0x80000001LL))");
    _ok(1,"mp_sizeof_int(-0x80000001LL) == 9",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x116,"mp_sizeof_int(-0x80000001LL)");
    _ok((uint)(buf[9] == -1 &&
              CONCAT44(buf._5_4_,CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1])))) ==
              -0x80000000002d),
        "memcmp(data, (\"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"), (9)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x116,"mp_encode(-0x80000001LL) == \"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"");
    buf[1] = -0x2d;
    buf[2] = -1;
    buf[3] = -1;
    buf[4] = -1;
    buf[5] = -1;
    buf[6] = '\x7f';
    buf[7] = -1;
    buf[8] = -1;
    buf[9] = -1;
    local_40 = (byte *)(buf + 1);
    local_38 = buf + 1;
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("int -0x80000001LL",0x11,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
    _ok((uint)(""[(byte)buf[1]] == '\b'),"mp_check_int(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x118,"mp_check_int(-0x80000001LL) == 0");
    if ((byte)buf[1] - 0xd0 < 3) {
      uVar9 = 0;
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      if (buf[1] == -0x2d) {
        uVar9 = (uint)(CONCAT17(buf[9],CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))))
                      == -0x8000000001);
        iVar8 = 1;
      }
      else {
        uVar9 = 0;
        if ((byte)buf[1] < 0xe0) goto LAB_001189cc;
      }
    }
    _ok(uVar9,"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80000001LL)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x118,"mp_decode(mp_encode(-0x80000001LL)) == -0x80000001LL");
    lVar10 = 1;
    do {
      lVar7 = (long)""[*local_40];
      if (lVar7 < 0) {
        if (*local_40 == 0xd9) {
          local_40 = local_40 + (ulong)local_40[1] + 2;
          goto LAB_00118075;
        }
        if (-0x20 < ""[*local_40]) {
          lVar10 = lVar10 - lVar7;
          local_40 = local_40 + 1;
          goto LAB_00118075;
        }
        mp_next_slowpath((char **)&local_40,lVar10);
        bVar3 = false;
        lVar7 = lVar10;
      }
      else {
        local_40 = local_40 + 1 + lVar7;
LAB_00118075:
        bVar3 = true;
        lVar7 = lVar10;
      }
    } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
    iVar4 = mp_check(&local_38,(char *)(local_40 + 9));
    _ok((uint)(iVar4 == 0),"!mp_check(&d4, d3 + 9)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x118,"mp_check(-0x80000001LL)");
    _ok(1,"(d1 - data) == (9)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x118,"len(mp_encode_int(-0x80000001LL)");
    _ok(iVar8,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x118,"len(mp_decode_int(-0x80000001LL))");
    _ok((uint)(local_40 == (byte *)(buf + 10)),"d1 == d3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x118,"len(mp_next_int(-0x80000001LL))");
    _ok((uint)(local_38 == buf + 10),"d1 == d4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x118,"len(mp_check_int(-0x80000001LL))");
    _ok(1,"mp_sizeof_int(-0x80000001LL) == 9",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x118,"mp_sizeof_int(-0x80000001LL)");
    _ok((uint)(buf[9] == -1 &&
              CONCAT44(buf._5_4_,CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1])))) ==
              -0x80000000002d),
        "memcmp(data, (\"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"), (9)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x118,"mp_encode(-0x80000001LL) == \"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"");
    buf[1] = -0x2d;
    buf[2] = -0x80;
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\x01';
    local_40 = (byte *)(buf + 1);
    local_38 = buf + 1;
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("int -0x7fffffffffffffffLL",0x19,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
    _ok((uint)(""[(byte)buf[1]] == '\b'),"mp_check_int(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x11a,"mp_check_int(-0x7fffffffffffffffLL) == 0");
    if ((byte)buf[1] - 0xd0 < 3) {
      uVar9 = 0;
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      if (buf[1] == -0x2d) {
        uVar9 = (uint)(CONCAT17(buf[9],CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))))
                      == 0x100000000000080);
        iVar8 = 1;
      }
      else {
        uVar9 = 0;
        if ((byte)buf[1] < 0xe0) goto LAB_001189d1;
      }
    }
    _ok(uVar9,"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7fffffffffffffffLL)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x11a,"mp_decode(mp_encode(-0x7fffffffffffffffLL)) == -0x7fffffffffffffffLL");
    lVar10 = 1;
    do {
      lVar7 = (long)""[*local_40];
      if (lVar7 < 0) {
        if (*local_40 == 0xd9) {
          local_40 = local_40 + (ulong)local_40[1] + 2;
          goto LAB_00118341;
        }
        if (-0x20 < ""[*local_40]) {
          lVar10 = lVar10 - lVar7;
          local_40 = local_40 + 1;
          goto LAB_00118341;
        }
        mp_next_slowpath((char **)&local_40,lVar10);
        bVar3 = false;
        lVar7 = lVar10;
      }
      else {
        local_40 = local_40 + 1 + lVar7;
LAB_00118341:
        bVar3 = true;
        lVar7 = lVar10;
      }
    } while ((bVar3) && (lVar10 = lVar7 + -1, 1 < lVar7));
    iVar5 = mp_check(&local_38,(char *)(local_40 + 9));
    iVar4 = 0;
    _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 9)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x11a,"mp_check(-0x7fffffffffffffffLL)");
    _ok(1,"(d1 - data) == (9)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x11a,"len(mp_encode_int(-0x7fffffffffffffffLL)");
    _ok(iVar8,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x11a,"len(mp_decode_int(-0x7fffffffffffffffLL))");
    _ok((uint)(local_40 == (byte *)(buf + 10)),"d1 == d3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x11a,"len(mp_next_int(-0x7fffffffffffffffLL))");
    _ok((uint)(local_38 == buf + 10),"d1 == d4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x11a,"len(mp_check_int(-0x7fffffffffffffffLL))");
    _ok(1,"mp_sizeof_int(-0x7fffffffffffffffLL) == 9",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x11a,"mp_sizeof_int(-0x7fffffffffffffffLL)");
    _ok((uint)(buf[9] == '\x01' &&
              CONCAT44(buf._5_4_,CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1])))) ==
              0x80d3),"memcmp(data, (\"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x01\"), (9)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x11a,
        "mp_encode(-0x7fffffffffffffffLL) == \"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x01\"");
    buf[1] = -0x2d;
    buf[2] = -0x80;
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    local_40 = (byte *)(buf + 1);
    local_38 = buf + 1;
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("int (int64_t)-0x8000000000000000LL",0x22,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_INT) goto LAB_001189db;
    _ok((uint)(""[(byte)buf[1]] == '\b'),"mp_check_int(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x11c,"mp_check_int((int64_t)-0x8000000000000000LL) == 0");
    if ((byte)buf[1] - 0xd0 < 3) {
      uVar9 = 0;
      iVar4 = 0;
LAB_001185ba:
      _ok(uVar9,"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == ((int64_t)-0x8000000000000000LL)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x11c,
          "mp_decode(mp_encode((int64_t)-0x8000000000000000LL)) == (int64_t)-0x8000000000000000LL");
      lVar10 = 1;
      do {
        lVar7 = (long)""[*local_40];
        if (lVar7 < 0) {
          if (*local_40 == 0xd9) {
            local_40 = local_40 + (ulong)local_40[1] + 2;
            goto LAB_0011860a;
          }
          if (-0x20 < ""[*local_40]) {
            lVar10 = lVar10 - lVar7;
            local_40 = local_40 + 1;
            goto LAB_0011860a;
          }
          mp_next_slowpath((char **)&local_40,lVar10);
          bVar3 = false;
          lVar7 = lVar10;
        }
        else {
          local_40 = local_40 + 1 + lVar7;
LAB_0011860a:
          bVar3 = true;
          lVar7 = lVar10;
        }
        if ((!bVar3) || (lVar10 = lVar7 + -1, lVar7 < 2)) {
          iVar8 = mp_check(&local_38,(char *)(local_40 + 9));
          _ok((uint)(iVar8 == 0),"!mp_check(&d4, d3 + 9)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11c,"mp_check((int64_t)-0x8000000000000000LL)");
          _ok(1,"(d1 - data) == (9)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11c,"len(mp_encode_int((int64_t)-0x8000000000000000LL)");
          _ok(iVar4,"d1 == d2",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11c,"len(mp_decode_int((int64_t)-0x8000000000000000LL))");
          _ok((uint)(local_40 == (byte *)(buf + 10)),"d1 == d3",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11c,"len(mp_next_int((int64_t)-0x8000000000000000LL))");
          _ok((uint)(local_38 == buf + 10),"d1 == d4",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11c,"len(mp_check_int((int64_t)-0x8000000000000000LL))");
          _ok(1,"mp_sizeof_int((int64_t)-0x8000000000000000LL) == 9",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11c,"mp_sizeof_int((int64_t)-0x8000000000000000LL)");
          _ok((uint)(buf[9] == '\0' &&
                    CONCAT44(buf._5_4_,CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1])))) ==
                    0x80d3),
              "memcmp(data, (\"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x00\"), (9)) == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11c,
              "mp_encode((int64_t)-0x8000000000000000LL) == \"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x00\""
             );
          _space((FILE *)_stdout);
          fwrite("# ",2,1,_stdout);
          fwrite("int_safe",8,1,_stdout);
          fputc(10,_stdout);
          _ok(1,"-sz == (5)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11e,"size after mp_encode_int_safe(NULL, &sz)");
          _ok(1,"d == NULL",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11e,"mp_encode_int_safe(NULL, &sz)");
          buf[1] = -0x2e;
          buf[2] = -0x80;
          buf[3] = '\0';
          buf[4] = '\0';
          buf._5_4_ = buf._5_4_ & 0xffffff00;
          _ok(1,"sz == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11e,"size after mp_encode_int_safe(buf, &sz)");
          _ok(1,"(d - data) == (5)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11e,"len of mp_encode_int_safe(buf, &sz)");
          _ok((uint)((buf._5_4_ & 0xff) == 0 &&
                    CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x80d2),
              "memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x00\"), (5)) == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11e,"mp_encode_int_safe(buf, &sz)");
          _ok(1,"sz == -1",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11e,"size after mp_encode_int_safe(buf, &sz) overflow");
          _ok(1,"d == data",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11e,"mp_encode_int_safe(buf, &sz) overflow");
          buf[1] = -0x2e;
          buf[2] = -0x80;
          buf[3] = '\0';
          buf[4] = '\0';
          buf._5_4_ = buf._5_4_ & 0xffffff00;
          _ok(1,"(d - data) == (5)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11e,"len of mp_encode_int_safe(buf, NULL)");
          _ok((uint)((buf._5_4_ & 0xff) == 0 &&
                    CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x80d2),
              "memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x00\"), (5)) == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x11e,"mp_encode_int_safe(buf, NULL)");
          _space((FILE *)_stdout);
          printf("# *** %s: done ***\n","test_ints");
          iVar8 = check_plan();
          return iVar8;
        }
      } while( true );
    }
    if (buf[1] == -0x2d) {
      uVar9 = (uint)(CONCAT17(buf[9],CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))))
                    == 0x80);
      iVar4 = 1;
      goto LAB_001185ba;
    }
    uVar9 = 0;
    if (0xdf < (byte)buf[1]) goto LAB_001185ba;
  }
  else {
    iVar8 = 0;
    if (buf[1] == -0x2d) {
      uVar9 = (uint)(CONCAT17(buf[9],CONCAT43(buf._5_4_,CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))))
                    == -0x8000000001);
      iVar8 = 1;
      goto LAB_00117d41;
    }
    uVar9 = 0;
    if (0xdf < (byte)buf[1]) goto LAB_00117d41;
LAB_001189c7:
    test_ints();
LAB_001189cc:
    test_ints();
LAB_001189d1:
    test_ints();
  }
  test_ints();
LAB_001189db:
  __assert_fail("mp_typeof(*cur) == MP_INT",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                ,0x8a5,"ptrdiff_t mp_check_int(const char *, const char *)");
}

Assistant:

static int
test_ints(void)
{
	plan(17*9 + 9);
	header();

	test_int(-0x01, "\xff", 1);
	test_int(-0x1e, "\xe2", 1);
	test_int(-0x1f, "\xe1", 1);
	test_int(-0x20, "\xe0", 1);
	test_int(-0x21, "\xd0\xdf", 2);

	test_int(-0x7f, "\xd0\x81", 2);
	test_int(-0x80, "\xd0\x80", 2);

	test_int(-0x81, "\xd1\xff\x7f", 3);
	test_int(-0x7fff, "\xd1\x80\x01", 3);
	test_int(-0x8000, "\xd1\x80\x00", 3);

	test_int(-0x8001, "\xd2\xff\xff\x7f\xff", 5);
	test_int(-0x7fffffff, "\xd2\x80\x00\x00\x01", 5);
	test_int(-0x80000000LL, "\xd2\x80\x00\x00\x00", 5);

	test_int(-0x80000001LL,
	     "\xd3\xff\xff\xff\xff\x7f\xff\xff\xff", 9);
	test_int(-0x80000001LL,
	     "\xd3\xff\xff\xff\xff\x7f\xff\xff\xff", 9);
	test_int(-0x7fffffffffffffffLL,
	     "\xd3\x80\x00\x00\x00\x00\x00\x00\x01", 9);
	test_int((int64_t)-0x8000000000000000LL,
	     "\xd3\x80\x00\x00\x00\x00\x00\x00\x00", 9);

	test_int_safe(-0x80000000LL, "\xd2\x80\x00\x00\x00", 5);

	footer();
	return check_plan();
}